

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_formatting.cpp
# Opt level: O2

bool short_parsing_fails(void)

{
  undefined1 uVar1;
  long local_1c8;
  stringstream ss;
  byte abStack_1a8 [360];
  short local_40 [4];
  short v;
  locale local_20 [15];
  allocator local_11;
  
  uVar1 = short_parsing_fails::fails;
  if (short_parsing_fails()::get_result != '\x01') {
    std::__cxx11::string::string((string *)local_40,"65000",&local_11);
    std::__cxx11::stringstream::stringstream
              ((stringstream *)&local_1c8,(string *)local_40,_S_out|_S_in);
    std::__cxx11::string::~string((string *)local_40);
    std::locale::classic();
    std::ios::imbue(local_20);
    std::locale::~locale(local_20);
    local_40[0] = 0;
    std::istream::operator>>((istream *)&local_1c8,local_40);
    uVar1 = (abStack_1a8[*(long *)(local_1c8 + -0x18)] & 5) != 0;
    short_parsing_fails()::get_result = '\x01';
    short_parsing_fails::fails = (bool)uVar1;
    std::__cxx11::stringstream::~stringstream((stringstream *)&local_1c8);
  }
  return (bool)uVar1;
}

Assistant:

bool short_parsing_fails()
{
    static bool fails = false;
    static bool get_result = false;
    if(get_result)
        return fails;
    std::stringstream ss("65000");
    ss.imbue(std::locale::classic());
    short v=0;
    ss >> v;
    fails = ss.fail();
    get_result = true;
    return fails;
}